

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldStatePdu.cpp
# Opt level: O2

void __thiscall DIS::MinefieldStatePdu::MinefieldStatePdu(MinefieldStatePdu *this)

{
  MinefieldFamilyPdu::MinefieldFamilyPdu(&this->super_MinefieldFamilyPdu);
  (this->super_MinefieldFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__MinefieldStatePdu_001c2440;
  MinefieldIdentifier::MinefieldIdentifier(&this->_minefieldID);
  this->_minefieldSequence = 0;
  this->_forceID = '\0';
  this->_numberOfPerimeterPoints = '\0';
  EntityType::EntityType(&this->_minefieldType);
  this->_numberOfMineTypes = 0;
  Vector3Double::Vector3Double(&this->_minefieldLocation);
  EulerAngles::EulerAngles(&this->_minefieldOrientation);
  this->_appearance = 0;
  this->_protocolMode = 0;
  (this->_perimeterPoints).super__Vector_base<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_perimeterPoints).super__Vector_base<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_perimeterPoints).super__Vector_base<DIS::Vector2Float,_std::allocator<DIS::Vector2Float>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_mineType).super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_mineType).super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_mineType).super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PduSuperclass::setPduType((PduSuperclass *)this,'%');
  return;
}

Assistant:

MinefieldStatePdu::MinefieldStatePdu() : MinefieldFamilyPdu(),
   _minefieldID(), 
   _minefieldSequence(0), 
   _forceID(0), 
   _numberOfPerimeterPoints(0), 
   _minefieldType(), 
   _numberOfMineTypes(0), 
   _minefieldLocation(), 
   _minefieldOrientation(), 
   _appearance(0), 
   _protocolMode(0)
{
    setPduType( 37 );
}